

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha1_Transform(sha2_word32 *state_in,sha2_word32 *data,sha2_word32 *state_out)

{
  sha2_word32 sVar1;
  uint uVar2;
  uint local_7c;
  sha2_word32 sStack_78;
  int j;
  sha2_word32 W1 [16];
  sha2_word32 T1;
  sha2_word32 e;
  sha2_word32 d;
  sha2_word32 c;
  sha2_word32 b;
  sha2_word32 a;
  sha2_word32 *state_out_local;
  sha2_word32 *data_local;
  sha2_word32 *state_in_local;
  
  d = state_in[1];
  e = state_in[2];
  T1 = state_in[3];
  W1[0xf] = state_in[4];
  local_7c = 0;
  c = *state_in;
  state_out_local = data;
  do {
    sVar1 = *state_out_local;
    (&sStack_78)[(int)local_7c] = sVar1;
    W1[0xe] = (c << 5 | c >> 0x1b) + (d & e ^ (d ^ 0xffffffff) & T1) + W1[0xf] + 0x5a827999 + sVar1;
    W1[0xf] = T1;
    T1 = e;
    e = d << 0x1e | d >> 2;
    d = c;
    local_7c = local_7c + 1;
    c = W1[0xe];
    state_out_local = state_out_local + 1;
  } while ((int)local_7c < 0x10);
  do {
    uVar2 = (&sStack_78)[(int)(local_7c + 0xd & 0xf)] ^ (&sStack_78)[(int)(local_7c + 8 & 0xf)] ^
            (&sStack_78)[(int)(local_7c + 2 & 0xf)] ^ (&sStack_78)[(int)(local_7c & 0xf)];
    uVar2 = uVar2 << 1 | uVar2 >> 0x1f;
    (&sStack_78)[(int)(local_7c & 0xf)] = uVar2;
    W1[0xe] = (c << 5 | c >> 0x1b) + (d & e ^ (d ^ 0xffffffff) & T1) + W1[0xf] + 0x5a827999 + uVar2;
    W1[0xf] = T1;
    T1 = e;
    e = d << 0x1e | d >> 2;
    d = c;
    local_7c = local_7c + 1;
    c = W1[0xe];
  } while ((int)local_7c < 0x14);
  do {
    uVar2 = (&sStack_78)[(int)(local_7c + 0xd & 0xf)] ^ (&sStack_78)[(int)(local_7c + 8 & 0xf)] ^
            (&sStack_78)[(int)(local_7c + 2 & 0xf)] ^ (&sStack_78)[(int)(local_7c & 0xf)];
    uVar2 = uVar2 << 1 | uVar2 >> 0x1f;
    (&sStack_78)[(int)(local_7c & 0xf)] = uVar2;
    W1[0xe] = (c << 5 | c >> 0x1b) + (d ^ e ^ T1) + W1[0xf] + 0x6ed9eba1 + uVar2;
    W1[0xf] = T1;
    T1 = e;
    e = d << 0x1e | d >> 2;
    d = c;
    local_7c = local_7c + 1;
    c = W1[0xe];
  } while ((int)local_7c < 0x28);
  do {
    uVar2 = (&sStack_78)[(int)(local_7c + 0xd & 0xf)] ^ (&sStack_78)[(int)(local_7c + 8 & 0xf)] ^
            (&sStack_78)[(int)(local_7c + 2 & 0xf)] ^ (&sStack_78)[(int)(local_7c & 0xf)];
    uVar2 = uVar2 << 1 | uVar2 >> 0x1f;
    (&sStack_78)[(int)(local_7c & 0xf)] = uVar2;
    W1[0xe] = (c << 5 | c >> 0x1b) + (d & e ^ d & T1 ^ e & T1) + W1[0xf] + -0x70e44324 + uVar2;
    W1[0xf] = T1;
    T1 = e;
    e = d << 0x1e | d >> 2;
    d = c;
    local_7c = local_7c + 1;
    sVar1 = T1;
    uVar2 = e;
    c = W1[0xe];
  } while ((int)local_7c < 0x3c);
  do {
    c = W1[0xe];
    e = uVar2;
    T1 = sVar1;
    uVar2 = (&sStack_78)[(int)(local_7c + 0xd & 0xf)] ^ (&sStack_78)[(int)(local_7c + 8 & 0xf)] ^
            (&sStack_78)[(int)(local_7c + 2 & 0xf)] ^ (&sStack_78)[(int)(local_7c & 0xf)];
    uVar2 = uVar2 << 1 | uVar2 >> 0x1f;
    (&sStack_78)[(int)(local_7c & 0xf)] = uVar2;
    W1[0xe] = (c << 5 | c >> 0x1b) + (d ^ e ^ T1) + W1[0xf] + -0x359d3e2a + uVar2;
    W1[0xf] = T1;
    uVar2 = d << 0x1e | d >> 2;
    d = c;
    local_7c = local_7c + 1;
    sVar1 = e;
  } while ((int)local_7c < 0x50);
  *state_out = *state_in + W1[0xe];
  state_out[1] = state_in[1] + c;
  state_out[2] = state_in[2] + uVar2;
  state_out[3] = state_in[3] + e;
  state_out[4] = state_in[4] + T1;
  return;
}

Assistant:

void sha1_Transform(const sha2_word32* state_in, const sha2_word32* data, sha2_word32* state_out) {
	sha2_word32	a, b, c, d, e;
	sha2_word32	T1;
	sha2_word32	W1[16];
	int		j;

	/* Initialize registers with the prev. intermediate value */
	a = state_in[0];
	b = state_in[1];
	c = state_in[2];
	d = state_in[3];
	e = state_in[4];
	j = 0;
	do {
		T1 = ROTL32(5, a) + Ch(b, c, d) + e + K1_0_TO_19 + (W1[j] = *data++);
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 16);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Ch(b,c,d) + e + K1_0_TO_19 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 20);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Parity(b,c,d) + e + K1_20_TO_39 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 40);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Maj(b,c,d) + e + K1_40_TO_59 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 60);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Parity(b,c,d) + e + K1_60_TO_79 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 80);


	/* Compute the current intermediate hash value */
	state_out[0] = state_in[0] + a;
	state_out[1] = state_in[1] + b;
	state_out[2] = state_in[2] + c;
	state_out[3] = state_in[3] + d;
	state_out[4] = state_in[4] + e;
}